

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O3

void __thiscall
icu_63::UVector::insertElementAt(UVector *this,void *obj,int32_t index,UErrorCode *status)

{
  UBool UVar1;
  ulong uVar2;
  
  if (((-1 < index) && (index <= this->count)) &&
     (UVar1 = ensureCapacity(this,this->count + 1,status), UVar1 != '\0')) {
    uVar2 = (ulong)(uint)this->count;
    if (index < this->count) {
      do {
        this->elements[uVar2] = this->elements[uVar2 - 1];
        uVar2 = uVar2 - 1;
      } while ((long)(ulong)(uint)index < (long)uVar2);
    }
    this->elements[(uint)index].pointer = obj;
    this->count = this->count + 1;
  }
  return;
}

Assistant:

void UVector::insertElementAt(void* obj, int32_t index, UErrorCode &status) {
    // must have 0 <= index <= count
    if (0 <= index && index <= count && ensureCapacity(count + 1, status)) {
        for (int32_t i=count; i>index; --i) {
            elements[i] = elements[i-1];
        }
        elements[index].pointer = obj;
        ++count;
    }
    /* else index out of range */
}